

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.hpp
# Opt level: O0

ssize_t __thiscall
de::BlockBuffer<unsigned_char>::read
          (BlockBuffer<unsigned_char> *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  BufferCanceledException *this_00;
  ssize_t extraout_RAX;
  int local_30;
  int numRead;
  uchar *elements_local;
  int numElements_local;
  BlockBuffer<unsigned_char> *this_local;
  
  if (this->m_canceled != 0) {
    this_00 = (BufferCanceledException *)__cxa_allocate_exception(8);
    BufferCanceledException::BufferCanceledException(this_00);
    __cxa_throw(this_00,&BufferCanceledException::typeinfo,
                BufferCanceledException::~BufferCanceledException);
  }
  Mutex::lock(&this->m_readLock);
  for (local_30 = 0; local_30 < __fd; local_30 = iVar1 + local_30) {
    iVar1 = readFromCurrentBlock(this,__fd - local_30,(uchar *)((long)__buf + (long)local_30),true);
  }
  Mutex::unlock(&this->m_readLock);
  return extraout_RAX;
}

Assistant:

void BlockBuffer<T>::read (int numElements, T* elements)
{
	DE_ASSERT(numElements > 0 && elements != DE_NULL);

	if (m_canceled)
		throw CanceledException();

	m_readLock.lock();

	int numRead = 0;
	while (numRead < numElements)
		numRead += readFromCurrentBlock(numElements-numRead, &elements[numRead], true /* blocking */);

	m_readLock.unlock();
}